

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O1

void __thiscall
phpconvert::ZendParser::debug
          (ZendParser *this,File *file,PreparedType *typeCopy,string *classNameLower,string *msg)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = std::__cxx11::string::find((char *)&file->fullPath,0x1312bc,0);
  if (lVar1 != -1) {
    std::operator+(&local_50,&file->fullPath,&file->name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_e0 = *plVar3;
      lStack_d8 = plVar2[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar3;
      local_f0 = (long *)*plVar2;
    }
    local_e8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f0,(ulong)(typeCopy->type)._M_dataplus._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_c0 = *plVar3;
      lStack_b8 = plVar2[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar3;
      local_d0 = (long *)*plVar2;
    }
    local_c8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_130 = &local_120;
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_120 = *plVar3;
      lStack_118 = plVar2[3];
    }
    else {
      local_120 = *plVar3;
      local_130 = (long *)*plVar2;
    }
    local_128 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_130,(ulong)(classNameLower->_M_dataplus)._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)(msg->_M_dataplus)._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_100 = *plVar3;
      lStack_f8 = plVar2[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar3;
      local_110 = (long *)*plVar2;
    }
    local_108 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_110,local_108);
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ZendParser::debug(const BaseParser::File &file, const PreparedType &typeCopy, const string &classNameLower,
                           string msg) const {
        if (file.fullPath.find("Zend/Paginator/Exception") != std::string::npos)
            cout << file.fullPath + file.name + ", type full: " + typeCopy.type + ", classname: " + classNameLower +
                    ", " + msg + "\n";
    }